

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::UnionInPlace
          (CharSetInner *this,ArenaAllocator *allocator,uint level,CharSetNode *other)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  CharSetNode *pCVar5;
  undefined4 extraout_var;
  _func_int **pp_Var6;
  long lVar7;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x1f8,"(level > 0)","level > 0");
    if (!bVar2) goto LAB_00cd7a4b;
    *puVar4 = 0;
  }
  if ((other == (CharSetNode *)&CharSetFull::Instance || other == (CharSetNode *)0x0) ||
     (iVar3 = (*other->_vptr_CharSetNode[0xd])(other), (char)iVar3 != '\0')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x1f9,
                       "(other != nullptr && other != CharSetFull::TheFullNode && !other->IsLeaf())"
                       ,"other != nullptr && other != CharSetFull::TheFullNode && !other->IsLeaf()")
    ;
    if (!bVar2) {
LAB_00cd7a4b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = true;
  lVar7 = 1;
  do {
    if (lVar7 == 0x11) {
      if (bVar2) {
        FreeSelf(this,allocator);
        this = (CharSetInner *)&CharSetFull::Instance;
      }
      return &this->super_CharSetNode;
    }
    pp_Var6 = other[lVar7]._vptr_CharSetNode;
    if (pp_Var6 == (_func_int **)0x0) {
      pCVar5 = this->children[lVar7 + -1];
LAB_00cd7a03:
      bVar2 = (bool)(bVar2 & pCVar5 == (CharSetNode *)&CharSetFull::Instance);
    }
    else {
      pCVar5 = this->children[lVar7 + -1];
      if (pp_Var6 != (_func_int **)&CharSetFull::Instance) {
        if (pCVar5 == (CharSetNode *)0x0) {
          pCVar5 = CharSetNode::For(allocator,level - 1);
          this->children[lVar7 + -1] = pCVar5;
          pp_Var6 = other[lVar7]._vptr_CharSetNode;
        }
        iVar3 = (*pCVar5->_vptr_CharSetNode[4])(pCVar5,allocator,(ulong)(level - 1),pp_Var6);
        pCVar5 = (CharSetNode *)CONCAT44(extraout_var,iVar3);
        this->children[lVar7 + -1] = pCVar5;
        goto LAB_00cd7a03;
      }
      if (pCVar5 != (CharSetNode *)0x0) {
        (**pCVar5->_vptr_CharSetNode)(pCVar5,allocator);
      }
      this->children[lVar7 + -1] = (CharSetNode *)&CharSetFull::Instance;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

CharSetNode* CharSetInner::UnionInPlace(ArenaAllocator* allocator, uint level, const CharSetNode* other)
    {
        Assert(level > 0);
        Assert(other != nullptr && other != CharSetFull::TheFullNode && !other->IsLeaf());
        CharSetInner* otherInner = (CharSetInner*)other;
        level--;
        bool isFull = true;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (otherInner->children[i] != nullptr)
            {
                if (otherInner->children[i] == CharSetFull::TheFullNode)
                {
                    if (children[i] != nullptr)
                        children[i]->FreeSelf(allocator);
                    children[i] = CharSetFull::TheFullNode;
                }
                else
                {
                    if (children[i] == nullptr)
                        children[i] = For(allocator, level);
                    children[i] = children[i]->UnionInPlace(allocator, level, otherInner->children[i]);
                    if (children[i] != CharSetFull::TheFullNode)
                        isFull = false;
                }
            }
            else if (children[i] != CharSetFull::TheFullNode)
                isFull = false;
        }
        if (isFull)
        {
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }